

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

int Gia_ManNameIsLegalInVerilog(char *pName)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  
  if (pName == (char *)0x0) {
LAB_001fbadb:
    __assert_fail("pName != NULL && *pName != \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                  ,0x4ca,"int Gia_ManNameIsLegalInVerilog(char *)");
  }
  cVar1 = *pName;
  iVar3 = 1;
  if (cVar1 != '\\') {
    if (cVar1 == '\0') goto LAB_001fbadb;
    if ((0xe5 < (byte)(cVar1 + 0x85U)) || (cVar1 == '_' || (byte)(cVar1 + 0xbfU) < 0x1a)) {
      do {
        pName = (char *)((byte *)pName + 1);
        bVar2 = *pName;
        if (bVar2 == 0) {
          return 1;
        }
      } while ((((0xf5 < (byte)(bVar2 - 0x3a)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) ||
               (bVar2 == 0x5f)) || (bVar2 == 0x24));
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Gia_ManNameIsLegalInVerilog( char * pName )
{
    // identifier ::= simple_identifier | escaped_identifier
    // simple_identifier ::= [a-zA-Z_][a-zA-Z0-9_$]
    // escaped_identifier ::= \ {Any_ASCII_character_except_white_space} white_space
    // white_space ::= space | tab | newline
    assert( pName != NULL && *pName != '\0' );
    if ( *pName == '\\' )
        return 1;
    if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && *pName != '_' )
        return 0;
    while ( *(++pName) )
        if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && (*pName < '0' || *pName > '9') && *pName != '_' && *pName != '$' ) 
            return 0;
    return 1;
}